

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O1

void parse_util::parse_double(string *nums,double *res,string *unit)

{
  long lVar1;
  double dVar2;
  string symb;
  string tmp;
  string snum;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  remove_spaces(&local_68,nums);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"smnu","");
  lVar1 = std::__cxx11::string::find_first_of((char *)&local_68,(ulong)local_88[0],0);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_replace((ulong)unit,0,(char *)unit->_M_string_length,0x165918);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)&local_68);
    std::__cxx11::string::operator=((string *)unit,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)&local_68);
  dVar2 = atof((char *)local_48[0]);
  *res = dVar2;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void parse_double(const string &nums, double &res, string &unit)
    {
        string tmp = remove_spaces(nums);
        string::size_type pos = 0;
        string symb = "smnu";

        pos = tmp.find_first_of(symb, pos);

        if (pos != string::npos)
            unit = tmp.substr(pos, tmp.size() - pos);
        else unit = "";

        string snum = tmp.substr(0,pos);
        res = atof(snum.c_str());
    }